

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::validateImportSource
          (ValidatorImpl *this,ImportSourcePtr *importSource,string *importName,string *importType)

{
  IssueImpl *pIVar1;
  bool bVar2;
  long lVar3;
  IssuePtr issue_1;
  string local_120;
  IssuePtr issue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string url;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ImportSource::url_abi_cxx11_
            (&url,(importSource->
                  super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  Entity::id_abi_cxx11_
            (&local_120,
             &((importSource->
               super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Entity);
  bVar2 = isValidXmlName(&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  if (!bVar2) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
    ;
    std::operator+(&local_50,"Import of ",importType);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                   &local_50," \'");
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                   importName);
    std::operator+(&local_d0,&local_f0,"\' does not have a valid \'id\' attribute, \'");
    Entity::id_abi_cxx11_
              (&local_70,
               &((importSource->
                 super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_Entity);
    std::operator+(&local_b0,&local_d0,&local_70);
    std::operator+(&local_120,&local_b0,"\'.");
    Issue::IssueImpl::setDescription(pIVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&issue_1);
    std::__cxx11::string::~string((string *)&local_50);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  if (url._M_string_length == 0) {
    Issue::IssueImpl::create();
    pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+(&local_f0,"Import of ",importType);
    std::operator+(&local_d0,&local_f0," \'");
    std::operator+(&local_b0,&local_d0,importName);
    std::operator+(&local_120,&local_b0,"\' does not have a valid locator xlink:href attribute.");
    Issue::IssueImpl::setDescription(pIVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    Issue::IssueImpl::setReferenceRule
              ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_HREF_LOCATOR);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
  }
  else {
    lVar3 = xmlParseURI(url._M_dataplus._M_p);
    if (lVar3 != 0) {
      xmlFreeURI(lVar3);
      goto LAB_0021d88c;
    }
    Issue::IssueImpl::create();
    pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::operator+(&local_f0,"Import of ",importType);
    std::operator+(&local_d0,&local_f0," \'");
    std::operator+(&local_b0,&local_d0,importName);
    std::operator+(&local_120,&local_b0,"\' has an invalid URI in the xlink:href attribute.");
    Issue::IssueImpl::setDescription(pIVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    Issue::IssueImpl::setReferenceRule
              ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_HREF_LOCATOR);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0021d88c:
  std::__cxx11::string::~string((string *)&url);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateImportSource(const ImportSourcePtr &importSource, const std::string &importName, const std::string &importType)
{
    std::string url = importSource->url();

    // Check for a valid identifier.
    if (!isValidXmlName(importSource->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' does not have a valid 'id' attribute, '" + importSource->id() + "'.");
        addIssue(issue);
    }

    if (url.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' does not have a valid locator xlink:href attribute.");
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF_LOCATOR);
        addIssue(issue);
    } else {
        xmlURIPtr uri = xmlParseURI(url.c_str());
        if (uri == nullptr) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' has an invalid URI in the xlink:href attribute.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF_LOCATOR);
            addIssue(issue);

        } else {
            xmlFreeURI(uri);
        }
    }
}